

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_utilities.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BamTools::Utilities::Split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *source,string *delims)

{
  char *__dest;
  char *__s;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = (char *)operator_new__(source->_M_string_length + 1);
  strcpy(__dest,(source->_M_dataplus)._M_p);
  __s = strtok(__dest,(delims->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar1 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __s = strtok((char *)0x0,(delims->_M_dataplus)._M_p);
    } while (__s != (char *)0x0);
  }
  operator_delete__(__dest);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Utilities::Split(const std::string& source, const std::string& delims)
{

    std::vector<std::string> fields;

    char* tok;
    char* cchars = new char[source.size() + 1];
    char* cstr = &cchars[0];
    std::strcpy(cstr, source.c_str());
    tok = std::strtok(cstr, delims.c_str());
    while (tok != NULL) {
        fields.push_back(tok);
        tok = std::strtok(NULL, delims.c_str());
    }

    delete[] cchars;

    return fields;
}